

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

int lisppathname(char *fullname,char *lispname,int dirp,int versionp)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 local_20b0;
  char *lfn_cp;
  char ver_buf [16];
  size_t len;
  char *pcStack_2080;
  int ver_no;
  char *lf_cp;
  char *end;
  char *start;
  uint local_2060;
  int extensionp;
  int mask;
  int i;
  char ver [16];
  char fbuf [4096];
  char namebuf [4096];
  char *cnamep;
  char *lnamep;
  char *dp;
  char *cp;
  int versionp_local;
  int dirp_local;
  char *lispname_local;
  char *fullname_local;
  
  iVar3 = strcmp(fullname,"/");
  if (iVar3 == 0) {
    strcpy(lispname,"<");
  }
  else {
    if (dirp == 0) {
      cnamep = lispname + -1;
      dp = lispname;
      while (*dp != '\0') {
        if (*dp == '\'') {
          if (dp[1] == '\0') {
            dp = dp + 1;
          }
          else {
            dp = dp + 2;
          }
        }
        else if (*dp == '>') {
          cnamep = dp + 1;
          dp = dp + 1;
        }
        else {
          dp = dp + 1;
        }
      }
      pcVar4 = strrchr(fullname,0x2f);
      namebuf._4088_8_ = pcVar4 + 1;
    }
    else {
      sVar5 = strlen(fullname);
      namebuf._4088_8_ = fullname + sVar5;
    }
    pcVar4 = fullname + 1;
    lnamep = fbuf + 0xff9;
    fbuf[0xff8] = '<';
    dp = pcVar4;
    if (*pcVar4 == '<') {
      fbuf[0xff9] = '\'';
      dp = fullname + 2;
      lnamep = fbuf + 0xffb;
      fbuf[0xffa] = *pcVar4;
    }
    for (; dp < (ulong)namebuf._4088_8_; dp = dp + 1) {
      switch(*dp) {
      case '\'':
      case ';':
      case '>':
        *lnamep = '\'';
        lnamep[1] = *dp;
        lnamep = lnamep + 2;
        break;
      default:
        *lnamep = *dp;
        lnamep = lnamep + 1;
        break;
      case '/':
        *lnamep = '>';
        lnamep = lnamep + 1;
      }
    }
    if (dirp == 0) {
      local_2060 = 0;
      extensionp = 1;
      while (pcVar4 = cnamep, cnamep = pcVar4 + 1, *cnamep != '\0') {
        if (*cnamep == '.') {
          if ((cnamep != lispname) && (*pcVar4 == '\'')) {
            local_2060 = extensionp | local_2060;
          }
          extensionp = extensionp << 1;
        }
      }
      extensionp = 1;
      for (; *dp != '\0'; dp = dp + 1) {
        switch(*dp) {
        case '\'':
        case ';':
        case '>':
          pcVar4 = lnamep + 1;
          *lnamep = '\'';
          lnamep = lnamep + 2;
          *pcVar4 = *dp;
          break;
        default:
          *lnamep = *dp;
          lnamep = lnamep + 1;
          break;
        case '.':
          if ((extensionp & local_2060) == extensionp) {
            *lnamep = '\'';
            lnamep[1] = *dp;
            lnamep = lnamep + 2;
          }
          else {
            *lnamep = *dp;
            lnamep = lnamep + 1;
          }
          extensionp = extensionp << 1;
        }
      }
      *lnamep = '\0';
      strcpy(ver + 8,fbuf + 0xff8);
      lnamep = ver + 8;
      dp = lnamep;
      while (*dp != '\0') {
        if (*dp == '\'') {
          if (dp[1] == '\0') {
            dp = dp + 1;
          }
          else {
            dp = dp + 2;
          }
        }
        else if (*dp == '>') {
          lnamep = dp;
          dp = dp + 1;
        }
        else {
          dp = dp + 1;
        }
      }
      dp = lnamep + 1;
      if (versionp != 0) {
        separate_version(ver + 8,(char *)&mask,1);
      }
      bVar2 = false;
      while( true ) {
        bVar1 = false;
        if (*dp != '\0') {
          bVar1 = (bool)(bVar2 ^ 1);
        }
        if (!bVar1) break;
        if (*dp == '\'') {
          if (dp[1] == '\0') {
            dp = dp + 1;
          }
          else {
            dp = dp + 2;
          }
        }
        else if (*dp == '.') {
          bVar2 = true;
        }
        else {
          dp = dp + 1;
        }
      }
      if (!bVar2) {
        *dp = '.';
        dp[1] = '\0';
      }
      if ((versionp == 0) || ((char)mask == '\0')) {
        strcpy(fbuf + 0xff8,ver + 8);
      }
      else if ((char)mask == '\0') {
        strcpy(fbuf + 0xff8,ver + 8);
      }
      else {
        strcpy(fbuf + 0xff8,ver + 8);
        strcat(fbuf + 0xff8,".~");
        strcat(fbuf + 0xff8,(char *)&mask);
        strcat(fbuf + 0xff8,"~");
      }
      if (versionp != 0) {
        lf_cp = strchr(fbuf + 0xff8,0x7e);
        end = lf_cp;
        pcVar4 = lf_cp;
        if (lf_cp == (char *)0x0) {
          strcat(fbuf + 0xff8,";1");
        }
        else {
          while (pcStack_2080 = pcVar4 + 1, *pcStack_2080 != '\0') {
            pcVar4 = pcStack_2080;
            if (*pcStack_2080 == '~') {
              end = lf_cp;
              lf_cp = pcStack_2080;
            }
          }
          if (((end == lf_cp) || (end[-1] != '.')) || (lf_cp != pcVar4)) {
            strcat(fbuf + 0xff8,";1");
          }
          else {
            strncpy((char *)&lfn_cp,end + 1,(size_t)(lf_cp + (-1 - (long)end)));
            *(char *)((long)&local_20b0 + (long)(lf_cp + (-1 - (long)end) + 8)) = '\0';
            if ((char)lfn_cp == '\0') {
LAB_0015e052:
              strcat(fbuf + 0xff8,";1");
            }
            else {
              for (local_20b0 = &lfn_cp; *(char *)local_20b0 != '\0';
                  local_20b0 = (char **)((long)local_20b0 + 1)) {
                if ((*(char *)local_20b0 < '0') || ('9' < *(char *)local_20b0)) goto LAB_0015e052;
              }
              end[-1] = ';';
              *end = '\0';
              *lf_cp = '\0';
              uVar6 = strtoul(end + 1,(char **)0x0,10);
              sprintf((char *)&lfn_cp,"%u",uVar6 & 0xffffffff);
              strcat(fbuf + 0xff8,(char *)&lfn_cp);
            }
          }
        }
      }
      strcpy(lispname,fbuf + 0xff8);
    }
    else {
      if ((lnamep[-1] != '>') || (lnamep[-2] == '\'')) {
        *lnamep = '>';
        lnamep = lnamep + 1;
      }
      *lnamep = '\0';
      strcpy(lispname,fbuf + 0xff8);
    }
  }
  return 1;
}

Assistant:

int lisppathname(char *fullname, char *lispname, int dirp, int versionp)
{
  char *cp, *dp, *lnamep, *cnamep;
  char namebuf[MAXPATHLEN], fbuf[MAXPATHLEN], ver[VERSIONLEN];
  int i, mask, extensionp;

  if (strcmp(fullname, DIRSEPSTR) == 0) {
    strcpy(lispname, "<");
    return (1);
  }

#ifdef DOS
  /* Split off the drive, if there is one. */
  if (fullname[1] == DRIVESEP) {
    *lispname++ = *fullname++;
    *lispname++ = *fullname++;
  }
#endif
  
  if (!dirp) {
    /*
     * The characters which are dealt with specially (i.e. are quoted)
     * in the Xerox Lisp file naming convention are all valid in UNIX
     * file name convention.  So the conversion rule is almost
     * straightforward except the "extension" field.  Only glancing
     * the UNIX file name, we cannot determine which period character
     * should be quoted in the result Xerox Lisp file name when more
     * than one period are included in the UNIX file name.  In such
     * case, we have to refer to the Xerox Lisp file name representation
     * which is specified the user.  Thus, at first, extract the
     * name field from the original Lisp file name.
     */
    cp = lispname;
    lnamep = cp - 1;
    while (*cp != '\0') {
      switch (*cp) {
        case '>':
          lnamep = cp + 1;
          cp++;
          break;

        case '\'':
          if (*(cp + 1) != '\0')
            cp += 2;
          else
            cp++;
          break;

        default: cp++; break;
      }
    }
    /* Name field in the UNIX file name representation. */
    cnamep = strrchr(fullname, DIRSEP) + 1;
  } else {
    cnamep = fullname + strlen(fullname);
  }

  /*
   * Conversion rule of file name from UNIX to Xerox Lisp.
   *	UNIX		Lisp
   *	/		<    only if it is used as a root directory
   *			     delimiter.
   *	/		>    if used as a directory delimiter for other
   *			     directories than root directory.
   *	>		'>
   *	;		';
   *	'		''
   *	.		'.   only if it is used as a part of the extension
   *			     field.
   *	others		as if
   */

  cp = fullname + 1;
  dp = namebuf;
  *dp++ = '<';

  if (*cp == '<') {
    /*
     * If the first character of the initial directory is '<',
     * it should be quoted in the result Lisp file name.
     */
    *dp++ = '\'';
    *dp++ = *cp++;
  }

  while (cp < cnamep) {
    switch (*cp) {
      case '>':
      case ';':
#ifndef DOS
      case '\'':
#endif /* DOS */
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

#ifdef DOS
      case '/':
#endif
      case DIRSEP:
        *dp++ = '>';
        cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  if (dirp) {
    if (*(dp - 1) != '>' || *(dp - 2) == '\'') *dp++ = '>';
    *dp = '\0';
    strcpy(lispname, namebuf);
    return (1);
  }

  /*
   * Be careful dealing with the extension field.  If we encounter with the
   * period mark which was quoted in the original Lisp file name, we have
   * to quote it in the result file name.
   * First we count the period mark included in the Lisp file name, and
   * remember the position of the quoted period.  Then when we met the
   * period while we are converting the UNIX file name into Lisp one,
   * examine it if it is a quoted one or not, then if so, we quote it.
   */

  mask = 0;
  i = 1;
  lnamep++;

  while (*lnamep) {
    if (*lnamep == '.') {
      if (lnamep != lispname && *(lnamep - 1) == '\'') mask |= i;
      i <<= 1;
    }
    lnamep++;
  }

  i = 1;
  while (*cp) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
        *dp++ = '/';
        cp++;
        break;
#endif
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      case '.':
        if ((i & mask) == i) {
          /* This period should be quoted. */
          *dp++ = '\'';
          *dp++ = *cp++;
        } else {
          *dp++ = *cp++;
        }
        i <<= 1;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file name
   * or not.  If extension field is not included, we have to add a period
   * to specify empty extension field.
   */
  strcpy(fbuf, namebuf);
  dp = cp = fbuf;
  while (*cp) {
    switch (*cp) {
      case '>':
        dp = cp;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  cp = dp + 1;
  if (versionp) separate_version(fbuf, ver, 1);
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.': extensionp = 1; break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    *cp++ = '.';
    *cp = '\0';
  }
  if (versionp && *ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }

  /*
   * Now, it's time to convert the version field.
   */
  if (!dirp && versionp) UnixVersionToLispVersion(namebuf, 0);

  strcpy(lispname, namebuf);
  return (1);
}